

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O3

int rtp_pkt_read(rtp_pkt_t *pkt,int fd)

{
  int iVar1;
  int iVar2;
  
  if (pkt == (rtp_pkt_t *)0x0) {
    __assert_fail("pkt != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp.c",0x9d,
                  "int rtp_pkt_read(rtp_pkt_t *, int)");
  }
  iVar1 = unix_read(fd,pkt->data,0x5dc);
  iVar2 = iVar1;
  if ((1 < iVar1 + 1U) && (iVar2 = -1, 0xb < iVar1)) {
    pkt->length = (long)iVar1;
    iVar2 = rtp_pkt_unpack(pkt);
    return iVar2;
  }
  return iVar2;
}

Assistant:

int rtp_pkt_read(rtp_pkt_t *pkt, int fd) {
  assert(pkt != NULL);
  
  ssize_t len;
  switch (len = unix_read(fd, pkt->data, RTP_PKT_SIZE)) {
  case 0:
    /* EOF */
    return 0;
  case -1:
    /* error */
    return -1;
  default:
    break;
  }

  /*M
    Check if the packet is long enough.
  **/
  if (len < RTP_HDR_SIZE)
    return -1;
  
  pkt->length = len;

  
  return rtp_pkt_unpack(pkt);
}